

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O0

void ARGBToRGB565DitherRow_SSE2(uint8_t *src,uint8_t *dst,uint32_t dither4,int width)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  ulong uVar6;
  undefined6 uVar7;
  int iVar8;
  uint uVar9;
  uint uVar12;
  uint uVar13;
  undefined1 auVar10 [16];
  uint uVar14;
  undefined1 auVar11 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 uVar20;
  undefined1 auVar17 [16];
  int width_local;
  uint32_t dither4_local;
  uint8_t *dst_local;
  uint8_t *src_local;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined2 uVar21;
  
  uVar20 = (undefined1)(dither4 >> 0x18);
  uVar21 = CONCAT11(uVar20,uVar20);
  uVar20 = (undefined1)(dither4 >> 0x10);
  uVar5 = CONCAT35(CONCAT21(uVar21,uVar20),CONCAT14(uVar20,dither4));
  uVar20 = (undefined1)(dither4 >> 8);
  uVar7 = CONCAT51(CONCAT41((int)((ulong)uVar5 >> 0x20),uVar20),uVar20);
  auVar17._0_2_ = CONCAT11((char)dither4,(char)dither4);
  uVar6 = CONCAT62(uVar7,auVar17._0_2_);
  auVar19._8_4_ = 0;
  auVar19._0_8_ = uVar6;
  auVar19._12_2_ = uVar21;
  auVar19._14_2_ = uVar21;
  uVar21 = (undefined2)((ulong)uVar5 >> 0x20);
  auVar18._12_4_ = auVar19._12_4_;
  auVar18._8_2_ = 0;
  auVar18._0_8_ = uVar6;
  auVar18._10_2_ = uVar21;
  auVar10._10_6_ = auVar18._10_6_;
  auVar10._8_2_ = uVar21;
  auVar10._0_8_ = uVar6;
  uVar21 = (undefined2)uVar7;
  auVar17._8_8_ = auVar10._8_8_;
  auVar17._6_2_ = uVar21;
  auVar17._4_2_ = uVar21;
  auVar17._2_2_ = auVar17._0_2_;
  do {
    auVar10 = paddusb(*(undefined1 (*) [16])src,auVar17);
    uVar9 = auVar10._0_4_;
    uVar12 = auVar10._4_4_;
    uVar13 = auVar10._8_4_;
    uVar14 = auVar10._12_4_;
    auVar15._0_4_ = uVar9 >> 3;
    auVar15._4_4_ = uVar12 >> 3;
    auVar15._8_4_ = uVar13 >> 3;
    auVar15._12_4_ = uVar14 >> 3;
    auVar16._0_4_ = uVar9 >> 5;
    auVar16._4_4_ = uVar12 >> 5;
    auVar16._8_4_ = uVar13 >> 5;
    auVar16._12_4_ = uVar14 >> 5;
    auVar11._0_4_ = (int)(uVar9 << 8) >> 0x10;
    auVar11._4_4_ = (int)(uVar12 << 8) >> 0x10;
    auVar11._8_4_ = (int)(uVar13 << 8) >> 0x10;
    auVar11._12_4_ = (int)(uVar14 << 8) >> 0x10;
    auVar2[8] = 0x1f;
    auVar2._0_8_ = 0x1f0000001f;
    auVar2._9_3_ = 0;
    auVar2[0xc] = 0x1f;
    auVar2._13_3_ = 0;
    auVar3[8] = 0xe0;
    auVar3._0_8_ = 0x7e0000007e0;
    auVar3[9] = 7;
    auVar3._10_2_ = 0;
    auVar3[0xc] = 0xe0;
    auVar3[0xd] = 7;
    auVar3._14_2_ = 0;
    auVar4[9] = 0xf8;
    auVar4._0_9_ = (unkuint9)0xfffff800fffff800;
    auVar4[10] = 0xff;
    auVar4[0xb] = 0xff;
    auVar4[0xc] = 0;
    auVar4[0xd] = 0xf8;
    auVar4[0xe] = 0xff;
    auVar4[0xf] = 0xff;
    auVar10 = auVar11 & auVar4 | auVar15 & auVar2 | auVar16 & auVar3;
    auVar10 = packssdw(auVar10,auVar10);
    src = (uint8_t *)((long)src + 0x10);
    *(long *)dst = auVar10._0_8_;
    dst = dst + 8;
    iVar8 = width + -4;
    bVar1 = 3 < width;
    width = iVar8;
  } while (iVar8 != 0 && bVar1);
  return;
}

Assistant:

void ARGBToRGB565DitherRow_SSE2(const uint8_t* src,
                                uint8_t* dst,
                                const uint32_t dither4,
                                int width) {
  asm volatile(
      "movd        %3,%%xmm6                     \n"
      "punpcklbw   %%xmm6,%%xmm6                 \n"
      "movdqa      %%xmm6,%%xmm7                 \n"
      "punpcklwd   %%xmm6,%%xmm6                 \n"
      "punpckhwd   %%xmm7,%%xmm7                 \n"
      "pcmpeqb     %%xmm3,%%xmm3                 \n"
      "psrld       $0x1b,%%xmm3                  \n"
      "pcmpeqb     %%xmm4,%%xmm4                 \n"
      "psrld       $0x1a,%%xmm4                  \n"
      "pslld       $0x5,%%xmm4                   \n"
      "pcmpeqb     %%xmm5,%%xmm5                 \n"
      "pslld       $0xb,%%xmm5                   \n"

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "paddusb     %%xmm6,%%xmm0                 \n"
      "movdqa      %%xmm0,%%xmm1                 \n"
      "movdqa      %%xmm0,%%xmm2                 \n"
      "pslld       $0x8,%%xmm0                   \n"
      "psrld       $0x3,%%xmm1                   \n"
      "psrld       $0x5,%%xmm2                   \n"
      "psrad       $0x10,%%xmm0                  \n"
      "pand        %%xmm3,%%xmm1                 \n"
      "pand        %%xmm4,%%xmm2                 \n"
      "pand        %%xmm5,%%xmm0                 \n"
      "por         %%xmm2,%%xmm1                 \n"
      "por         %%xmm1,%%xmm0                 \n"
      "packssdw    %%xmm0,%%xmm0                 \n"
      "lea         0x10(%0),%0                   \n"
      "movq        %%xmm0,(%1)                   \n"
      "lea         0x8(%1),%1                    \n"
      "sub         $0x4,%2                       \n"
      "jg          1b                            \n"
      : "+r"(src),    // %0
        "+r"(dst),    // %1
        "+r"(width)   // %2
      : "m"(dither4)  // %3
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5", "xmm6",
        "xmm7");
}